

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser_error parse_pain_message(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *pcVar3;
  long lVar4;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pVar1 = PARSE_ERROR_TOO_MANY_ENTRIES;
    for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
      if (*(long *)((long)pvVar2 + lVar4 * 8) == 0) {
        pcVar3 = parser_getstr(p,"message");
        pcVar3 = string_make(pcVar3);
        *(char **)((long)pvVar2 + lVar4 * 8) = pcVar3;
        return PARSE_ERROR_NONE;
      }
    }
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_pain_message(struct parser *p) {
	struct monster_pain *mp = parser_priv(p);
	int i;

	if (!mp)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	for (i = 0; i < 7; i++)
		if (!mp->messages[i])
			break;
	if (i == 7)
		return PARSE_ERROR_TOO_MANY_ENTRIES;
	mp->messages[i] = string_make(parser_getstr(p, "message"));
	return PARSE_ERROR_NONE;
}